

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QDockWidgetGroupLayout::setGeometry(QDockWidgetGroupLayout *this,QRect *r)

{
  long lVar1;
  Representation RVar2;
  bool bVar3;
  QDockAreaLayoutInfo *pQVar4;
  undefined8 in_RSI;
  QDockWidgetGroupLayout *in_RDI;
  long in_FS_OFFSET;
  QRect QVar5;
  QDockWidgetGroupWindow *in_stack_00000008;
  int fw;
  QDockAreaLayoutInfo *li;
  QDockAreaLayoutInfo *in_stack_00000048;
  undefined1 in_stack_ffffffffffffffaf;
  QRect *in_stack_ffffffffffffffb0;
  QWidgetResizeHandler *this_00;
  QDockWidgetGroupLayout *pQVar6;
  QWidget *parent;
  undefined1 in_stack_ffffffffffffffe8 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  groupWindow((QDockWidgetGroupLayout *)0x60391f);
  QDockWidgetGroupWindow::destroyOrHideIfEmpty(in_stack_00000008);
  pQVar4 = dockAreaLayoutInfo(in_RDI);
  bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x603940);
  if (!bVar3) {
    frameWidth(in_RDI);
    QLayout::parentWidget(&in_RDI->super_QLayout);
    parent = in_stack_ffffffffffffffe8._0_8_;
    QDockAreaLayoutInfo::reparentWidgets(in_stack_ffffffffffffffe8._8_8_,parent);
    QVar5 = QRect::adjusted((QRect *)parent,(int)((ulong)pQVar6 >> 0x20),(int)pQVar6,
                            (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    (pQVar4->rect).x1 = (Representation)(int)QVar5._0_8_;
    (pQVar4->rect).y1 = (Representation)(int)((ulong)QVar5._0_8_ >> 0x20);
    (pQVar4->rect).x2 = (Representation)(int)QVar5._8_8_;
    (pQVar4->rect).y2 = (Representation)(int)((ulong)QVar5._8_8_ >> 0x20);
    QDockAreaLayoutInfo::fitItems(in_stack_00000048);
    QDockAreaLayoutInfo::apply((QDockAreaLayoutInfo *)r,li._7_1_);
    bVar3 = QRect::isValid(in_stack_ffffffffffffffb0);
    if (bVar3) {
      RVar2.m_i = (pQVar4->rect).y1.m_i;
      (in_RDI->savedState).rect.x1 = (Representation)(pQVar4->rect).x1.m_i;
      (in_RDI->savedState).rect.y1 = (Representation)RVar2.m_i;
      RVar2.m_i = (pQVar4->rect).y2.m_i;
      (in_RDI->savedState).rect.x2 = (Representation)(pQVar4->rect).x2.m_i;
      (in_RDI->savedState).rect.y2 = (Representation)RVar2.m_i;
    }
    this_00 = in_RDI->resizer;
    nativeWindowDeco((QDockWidgetGroupLayout *)0x603a22);
    QWidgetResizeHandler::setEnabled(this_00,(bool)in_stack_ffffffffffffffaf);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void setGeometry(const QRect&r) override
    {
        groupWindow()->destroyOrHideIfEmpty();
        QDockAreaLayoutInfo *li = dockAreaLayoutInfo();
        if (li->isEmpty())
            return;
        int fw = frameWidth();
#if QT_CONFIG(tabbar)
        li->reparentWidgets(parentWidget());
#endif
        li->rect = r.adjusted(fw, fw, -fw, -fw);
        li->fitItems();
        li->apply(false);
        if (savedState.rect.isValid())
            savedState.rect = li->rect;
        resizer->setEnabled(!nativeWindowDeco());
    }